

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ProgramLogCase::iterate(ProgramLogCase *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  TestLog *pTVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  MessageBuilder *this_00;
  int *params;
  uint *puVar7;
  MessageBuilder local_3e0;
  undefined1 local_25c [8];
  StateQueryMemoryWriteGuard<int> logLen;
  undefined1 local_180 [8];
  ShaderProgram program;
  CallLogWrapper gl;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  ProgramLogCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,pTVar5,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
  pRVar6 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  getProgramSources((ProgramSources *)&logLen.m_value,this);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_180,pRVar6,(ProgramSources *)&logLen.m_value);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&logLen.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_25c);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,true);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_3e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      (&local_3e0,(char (*) [33])"Trying to link a broken program.");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3e0);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
  params = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_25c);
  glu::CallLogWrapper::glGetProgramiv
            ((CallLogWrapper *)&program.m_program.m_info.linkTimeUs,dVar4,0x8b84,params);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            ((StateQueryMemoryWriteGuard<int> *)local_25c,(ResultCollector *)local_60);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_25c,(ResultCollector *)local_60);
  if (bVar2) {
    puVar7 = (uint *)deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                               ((StateQueryMemoryWriteGuard *)local_25c);
    uVar1 = *puVar7;
    dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_180);
    verifyInfoLogQuery((Functional *)local_60,
                       (ResultCollector *)&program.m_program.m_info.linkTimeUs,
                       (CallLogWrapper *)(ulong)uVar1,dVar4,0x27d0780,0,"glGetProgramInfoLog");
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_180);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)&program.m_program.m_info.linkTimeUs);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

ProgramLogCase::IterateResult ProgramLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result		(m_testCtx.getLog());
	glu::CallLogWrapper						gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram						program		(m_context.getRenderContext(), getProgramSources());
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to link a broken program." << tcu::TestLog::EndMessage;

	gl.glGetProgramiv(program.getProgram(), GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (logLen.verifyValidity(result))
		verifyInfoLogQuery(result, gl, logLen, program.getProgram(), &glu::CallLogWrapper::glGetProgramInfoLog, "glGetProgramInfoLog");

	result.setTestContextResult(m_testCtx);
	return STOP;
}